

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readdata.cpp
# Opt level: O1

int __thiscall ReadData::ReadSocketData(ReadData *this,BUFF *buff,int desc)

{
  ssize_t sVar1;
  int i;
  int iVar2;
  long lVar3;
  uint uVar4;
  uchar tmp [1024];
  undefined1 auStack_428 [1024];
  
  lVar3 = (long)buff->pos;
  if (lVar3 != 0) {
    do {
      *(uchar *)((long)buff + (lVar3 - buff->pos)) = buff->buff[lVar3];
      lVar3 = lVar3 + 1;
    } while( true );
  }
  iVar2 = 0;
  do {
    memset(auStack_428,0,0x400);
    sVar1 = recv(desc,auStack_428,0x400,0);
    uVar4 = (uint)sVar1;
    if (0 < (int)uVar4) {
      memcpy(buff->buff + iVar2,auStack_428,(ulong)(uVar4 & 0x7fffffff));
      iVar2 = iVar2 + uVar4;
    }
  } while (iVar2 < 0x7698);
  buff->len = iVar2;
  buff->pos = 0;
  return 0;
}

Assistant:

int ReadData::ReadSocketData(BUFF &buff, int desc) {
    // 将数据先读入缓冲区
    if(buff.pos != 0)
        reset(buff);
    int count = buff.pos;
    try
    {
        while (count < MAXDATALEN)
        {
            unsigned char tmp[1024];
            memset(tmp, 0x00, 1024);
            int num = recv(desc, tmp, 1024, 0);
            for(int i = 0; i < num; ++i)
                buff.buff[count++] = tmp[i];
            // buff[count] = tmp;
        }
        buff.len = count;
        buff.pos = 0;
        return 0;
    }
    catch(...)
    {
        cout << "error happened when getting data from socket" << endl;
        return UNKNOWN_ERROR;
    } 
}